

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexSets.cpp
# Opt level: O2

void __thiscall TasGrid::StorageSet::write<false>(StorageSet *this,ostream *os)

{
  IO::writeNumbers<false,(TasGrid::IO::IOPad)1,int,int>
            (os,(int)this->num_outputs,(int)this->num_values);
  IO::writeFlag<false,(TasGrid::IO::IOPad)4>
            ((this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             (this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,os);
  if ((this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    IO::writeVector<false,(TasGrid::IO::IOPad)3,double>(&this->values,os);
    return;
  }
  return;
}

Assistant:

void StorageSet::write(std::ostream &os) const{
    IO::writeNumbers<iomode, IO::pad_rspace>(os, static_cast<int>(num_outputs), static_cast<int>(num_values));
    IO::writeFlag<iomode, IO::pad_auto>((values.size() != 0), os);
    if (values.size() != 0)
        IO::writeVector<iomode, IO::pad_line>(values, os);
}